

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopedPrinter.cpp
# Opt level: O2

string * __thiscall
llvm::to_hexString_abi_cxx11_
          (string *__return_storage_ptr__,llvm *this,uint64_t Value,bool UpperCase)

{
  string *psVar1;
  FormattedNumber local_78;
  undefined1 local_60 [8];
  raw_string_ostream stream;
  string number;
  
  local_78.Upper = SUB81(Value,0);
  stream.OS = (string *)&number._M_string_length;
  number._M_dataplus._M_p = (pointer)0x0;
  number._M_string_length._0_1_ = 0;
  local_78.Width = 1;
  stream.super_raw_ostream.OutBufEnd = (char *)0x0;
  stream.super_raw_ostream._vptr_raw_ostream = (_func_int **)0x0;
  stream.super_raw_ostream.OutBufStart = (char *)0x0;
  local_60 = (undefined1  [8])&PTR__raw_string_ostream_01129208;
  stream.super_raw_ostream._32_8_ = &stream.OS;
  local_78.DecValue = 0;
  local_78.Hex = true;
  local_78.HexPrefix = false;
  local_78.HexValue = (uint64_t)this;
  stream.super_raw_ostream.OutBufCur._0_4_ = local_78.Width;
  raw_ostream::operator<<((raw_ostream *)local_60,&local_78);
  psVar1 = raw_string_ostream::str_abi_cxx11_((raw_string_ostream *)local_60);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  raw_string_ostream::~raw_string_ostream((raw_string_ostream *)local_60);
  std::__cxx11::string::~string((string *)&stream.OS);
  return __return_storage_ptr__;
}

Assistant:

const std::string to_hexString(uint64_t Value, bool UpperCase) {
  std::string number;
  llvm::raw_string_ostream stream(number);
  stream << format_hex_no_prefix(Value, 1, UpperCase);
  return stream.str();
}